

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void pipe_list(t_pipe *x,t_symbol *s,int ac,t_atom *av)

{
  int *piVar1;
  int iVar2;
  t_atomtype tVar3;
  t_gstub *ptVar4;
  int iVar5;
  undefined4 uVar6;
  t_hang_conflict *owner;
  t_gpointer *ptVar7;
  t_symbol *ptVar8;
  word *pwVar9;
  _clock *x_00;
  t_gpointer *ptVar10;
  long lVar11;
  t_float tVar12;
  float fVar13;
  
  owner = (t_hang_conflict *)getbytes((long)x->x_n * 8 + 0x20);
  iVar2 = x->x_n;
  ptVar7 = (t_gpointer *)getbytes((long)x->x_nptr * 0x18);
  owner->h_gp = ptVar7;
  if (iVar2 < ac) {
    ac = iVar2;
    if (av[iVar2].a_type == A_FLOAT) {
      x->x_deltime = av[iVar2].a_w.w_float;
    }
    else {
      pd_error(x,"pipe: symbol or pointer in time inlet");
    }
  }
  if (0 < ac) {
    ptVar7 = x->x_gp;
    pwVar9 = &(x->x_vec->p_atom).a_w;
    do {
      tVar3 = ((t_atom *)(pwVar9 + -1))->a_type;
      if (tVar3 == A_POINTER) {
        gpointer_unset(ptVar7);
        if (av->a_type == A_POINTER) {
          ptVar10 = (av->a_w).w_gpointer;
          ptVar4 = ptVar10->gp_stub;
          ptVar7->gp_stub = ptVar4;
          iVar5 = ptVar10->gp_valid;
          uVar6 = *(undefined4 *)&ptVar10->field_0xc;
          ptVar7->gp_un = ptVar10->gp_un;
          ptVar7->gp_valid = iVar5;
          *(undefined4 *)&ptVar7->field_0xc = uVar6;
          if (ptVar4 != (t_gstub *)0x0) {
            ptVar4->gs_refcount = ptVar4->gs_refcount + 1;
          }
        }
        else {
          pd_error(x,"pipe: bad pointer");
        }
        ptVar7 = ptVar7 + 1;
      }
      else if (tVar3 == A_SYMBOL) {
        ptVar8 = atom_getsymbol(av);
        pwVar9->w_symbol = ptVar8;
      }
      else if (tVar3 == A_FLOAT) {
        tVar12 = atom_getfloat(av);
        pwVar9->w_float = tVar12;
      }
      av = av + 1;
      pwVar9 = pwVar9 + 3;
      ac = ac + -1;
    } while (ac != 0);
  }
  if (0 < iVar2) {
    ptVar7 = owner->h_gp;
    ptVar10 = x->x_gp;
    pwVar9 = &(x->x_vec->p_atom).a_w;
    lVar11 = 0;
    do {
      if (((t_atom *)(pwVar9 + -1))->a_type == A_POINTER) {
        if (ptVar10->gp_stub != (t_gstub *)0x0) {
          piVar1 = &ptVar10->gp_stub->gs_refcount;
          *piVar1 = *piVar1 + 1;
        }
        owner->h_vec[lVar11].w_symbol = (t_symbol *)ptVar7;
        ptVar7->gp_stub = ptVar10->gp_stub;
        iVar5 = ptVar10->gp_valid;
        uVar6 = *(undefined4 *)&ptVar10->field_0xc;
        ptVar7->gp_un = ptVar10->gp_un;
        ptVar7->gp_valid = iVar5;
        *(undefined4 *)&ptVar7->field_0xc = uVar6;
        ptVar7 = ptVar7 + 1;
        ptVar10 = ptVar10 + 1;
      }
      else {
        owner->h_vec[lVar11] = *pwVar9;
      }
      lVar11 = lVar11 + 1;
      pwVar9 = pwVar9 + 3;
    } while (iVar2 != (int)lVar11);
  }
  owner->h_next = x->x_hang;
  x->x_hang = owner;
  owner->h_owner = x;
  x_00 = clock_new(owner,hang_tick);
  owner->h_clock = x_00;
  fVar13 = x->x_deltime;
  if (fVar13 <= 0.0) {
    fVar13 = 0.0;
  }
  clock_delay(x_00,(double)fVar13);
  return;
}

Assistant:

static void pipe_list(t_pipe *x, t_symbol *s, int ac, t_atom *av)
{
    t_hang *h = (t_hang *)
        getbytes(sizeof(*h) + (x->x_n - 1) * sizeof(*h->h_vec));
    t_gpointer *gp, *gp2;
    t_pipeout *p;
    int i, n = x->x_n;
    t_atom *ap;
    t_word *w;
    h->h_gp = (t_gpointer *)getbytes(x->x_nptr * sizeof(t_gpointer));
    if (ac > n)
    {
        if (av[n].a_type == A_FLOAT)
            x->x_deltime = av[n].a_w.w_float;
        else pd_error(x, "pipe: symbol or pointer in time inlet");
        ac = n;
    }
    for (i = 0, gp = x->x_gp, p = x->x_vec, ap = av; i < ac;
        i++, p++, ap++)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: p->p_atom.a_w.w_float = atom_getfloat(ap); break;
        case A_SYMBOL: p->p_atom.a_w.w_symbol = atom_getsymbol(ap); break;
        case A_POINTER:
            gpointer_unset(gp);
            if (ap->a_type != A_POINTER)
                pd_error(x, "pipe: bad pointer");
            else
            {
                *gp = *(ap->a_w.w_gpointer);
                if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            }
            gp++;
        default: break;
        }
    }
    for (i = 0, gp = x->x_gp, gp2 = h->h_gp, p = x->x_vec, w = h->h_vec;
        i < n; i++, p++, w++)
    {
        if (p->p_atom.a_type == A_POINTER)
        {
            if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            w->w_gpointer = gp2;
            *gp2++ = *gp++;
        }
        else *w = p->p_atom.a_w;
    }
    h->h_next = x->x_hang;
    x->x_hang = h;
    h->h_owner = x;
    h->h_clock = clock_new(h, (t_method)hang_tick);
    clock_delay(h->h_clock, (x->x_deltime >= 0 ? x->x_deltime : 0));
}